

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::sc35_splice_info::parse(sc35_splice_info *this,uint8_t *ptr,uint size)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ostream *this_00;
  unsigned_long_long uVar6;
  uint8_t *pt;
  reference local_c0;
  bitset<8UL> local_b0;
  bitset<8UL> bb;
  bitset<32UL> a;
  undefined1 local_98 [4];
  uint32_t wd;
  reference local_88;
  reference local_78;
  byte local_61;
  undefined1 local_60 [7];
  bool pts_highest_bit;
  _Base_bitset<1UL> local_50;
  reference local_48;
  reference local_38;
  bitset<8UL> local_28;
  bitset<8UL> b;
  uint size_local;
  uint8_t *ptr_local;
  sc35_splice_info *this_local;
  
  this->table_id_ = *ptr;
  b.super__Base_bitset<1UL>._M_w._4_4_ = size;
  if (this->table_id_ == 0xfc) {
    std::bitset<8UL>::bitset(&local_28,(ulong)ptr[1]);
    std::bitset<8UL>::operator[]((bitset<8UL> *)&local_38,(size_t)&local_28);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_38);
    this->section_syntax_indicator_ = bVar2;
    std::bitset<8UL>::reference::~reference(&local_38);
    std::bitset<8UL>::operator[]((bitset<8UL> *)&local_48,(size_t)&local_28);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_48);
    this->private_indicator_ = bVar2;
    std::bitset<8UL>::reference::~reference(&local_48);
    uVar3 = anon_unknown.dwarf_27f3a::fmp4_read_uint16((char *)(ptr + 1));
    this->section_length_ = uVar3 & 0xfff;
    this->protocol_version_ = ptr[3];
    std::bitset<8UL>::bitset((bitset<8UL> *)&local_50,(ulong)ptr[4]);
    local_28.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)local_50._M_w;
    std::bitset<8UL>::operator[]((bitset<8UL> *)local_60,(size_t)&local_28);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)local_60);
    this->encrypted_packet_ = bVar2;
    std::bitset<8UL>::reference::~reference((reference *)local_60);
    std::bitset<8UL>::operator[]((bitset<8UL> *)&local_78,(size_t)&local_28);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_78);
    std::bitset<8UL>::reference::~reference(&local_78);
    local_61 = bVar2;
    std::bitset<8UL>::operator[]((bitset<8UL> *)&local_88,(size_t)&local_28);
    std::bitset<8UL>::reference::operator=(&local_88,false);
    std::bitset<8UL>::reference::~reference(&local_88);
    std::bitset<8UL>::operator[]((bitset<8UL> *)local_98,(size_t)&local_28);
    std::bitset<8UL>::reference::operator=((reference *)local_98,false);
    std::bitset<8UL>::reference::~reference((reference *)local_98);
    uVar6 = std::bitset<8UL>::to_ullong(&local_28);
    this->encryption_algorithm_ = (uint8_t)(uVar6 >> 1);
    uVar4 = anon_unknown.dwarf_27f3a::fmp4_read_uint32((char *)(ptr + 5));
    this->pts_adjustment_ = (ulong)uVar4;
    if ((local_61 & 1) != 0) {
      uVar5 = std::numeric_limits<unsigned_int>::max();
      this->pts_adjustment_ = (ulong)uVar5 + this->pts_adjustment_;
    }
    this->cw_index_ = ptr[9];
    uVar4 = anon_unknown.dwarf_27f3a::fmp4_read_uint32((char *)(ptr + 10));
    std::bitset<32UL>::bitset((bitset<32UL> *)&bb,(ulong)uVar4);
    this->tier_ = uVar4 >> 0x14;
    this->splice_command_length_ = (uVar4 & 0xfff00) >> 8;
    this->splice_command_type_ = (uint8_t)uVar4;
    pt = ptr + 0xe;
    uVar3 = anon_unknown.dwarf_27f3a::fmp4_read_uint16((char *)pt);
    this->descriptor_loop_length_ = uVar3;
    uVar1 = this->descriptor_loop_length_;
    if (this->splice_command_type_ == '\x05') {
      uVar4 = anon_unknown.dwarf_27f3a::fmp4_read_uint32((char *)(pt + (int)(uint)uVar1));
      this->splice_insert_event_id_ = uVar4;
      std::bitset<8UL>::bitset(&local_b0,(ulong)(pt + (int)(uint)uVar1)[4]);
      std::bitset<8UL>::operator[]((bitset<8UL> *)&local_c0,(size_t)&local_b0);
      bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)&local_c0);
      this->splice_event_cancel_indicator_ = bVar2;
      std::bitset<8UL>::reference::~reference(&local_c0);
    }
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout," error parsing table id, tableid != 0xFC ");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void sc35_splice_info::parse(const uint8_t *ptr, unsigned int size)
	{
		table_id_ = *ptr++;

		if (table_id_ != 0xFC)
		{
			std::cout << " error parsing table id, tableid != 0xFC " << std::endl;
			return;
		}

		std::bitset<8> b(*ptr);
		section_syntax_indicator_ = b[7];
		private_indicator_ = b[6];
		section_length_ = 0x0FFF & fmp4_read_uint16((char *)ptr);
		ptr += 2;
		protocol_version_ = (uint8_t)*ptr++;

		b = std::bitset<8>(*ptr);

		encrypted_packet_ = b[7];
		bool pts_highest_bit = b[0];

		b[0] = 0;
		b[7] = 0;
		encryption_algorithm_ = uint8_t(b.to_ullong() >> 1);
		ptr++;

		pts_adjustment_ = (uint64_t)fmp4_read_uint32((char *)ptr);
		if (pts_highest_bit)
		{
			pts_adjustment_ += (uint64_t)std::numeric_limits<uint32_t>::max();
		}
		ptr = ptr + 4;
		cw_index_ = *ptr++;

		uint32_t wd = fmp4_read_uint32((char *)ptr);
		std::bitset<32> a(wd);
		tier_ = (wd & 0xFFF00000) >> 20;
		splice_command_length_ = (0x000FFF00 & wd) >> 8;
		splice_command_type_ = (uint8_t)(0x000000FF & wd);
		ptr += 4;
		descriptor_loop_length_ = fmp4_read_uint16((char *)ptr);

		ptr += descriptor_loop_length_;
		if (splice_command_type_ == 0x05) {
			splice_insert_event_id_ = fmp4_read_uint32((char *)ptr);
			ptr += 4;
			std::bitset<8> bb(*ptr);
			splice_event_cancel_indicator_ = bb[7];
		}
	}